

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

void __thiscall dtc::fdt::checking::check_manager::check_manager(check_manager *this)

{
  address_cells_checker *this_00;
  deleted_node_checker *this_01;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_address_cells_checker_*>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  deleted_node_checker *local_158;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::(anonymous_namespace)::deleted_node_checker_*>
  local_128;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
  local_100;
  undefined1 local_f8;
  address_cells_checker *local_f0;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::(anonymous_namespace)::address_cells_checker_*>
  local_c0;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  check_manager *local_10;
  check_manager *this_local;
  
  local_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>_>
  ::unordered_map(&this->checkers);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>_>
  ::unordered_map(&this->disabled_checkers);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"compatible",&local_31);
  add_property_type_checker<(dtc::fdt::property_value::value_type)0>
            (this,"type-compatible",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"model",&local_69);
  add_property_type_checker<(dtc::fdt::property_value::value_type)1>(this,"type-model",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"phandle",&local_91);
  add_property_size_checker(this,"type-phandle",&local_90,4);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"cells-attributes",&local_e1);
  this_00 = (address_cells_checker *)operator_new(0x28);
  anon_unknown_4::address_cells_checker::address_cells_checker(this_00,"cells-attributes");
  local_f0 = this_00;
  std::
  make_pair<std::__cxx11::string,dtc::fdt::checking::(anonymous_namespace)::address_cells_checker*>
            (&local_c0,&local_e0,&local_f0);
  _Var1 = std::
          unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
          ::
          insert<std::pair<std::__cxx11::string,dtc::fdt::checking::(anonymous_namespace)::address_cells_checker*>>
                    ((unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
                      *)&this->disabled_checkers,&local_c0);
  local_100._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
       ._M_cur;
  local_f8 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::(anonymous_namespace)::address_cells_checker_*>
  ::~pair(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"deleted-nodes",&local_149);
  this_01 = (deleted_node_checker *)operator_new(0x28);
  anon_unknown_4::deleted_node_checker::deleted_node_checker(this_01,"deleted-nodes");
  local_158 = this_01;
  std::
  make_pair<std::__cxx11::string,dtc::fdt::checking::(anonymous_namespace)::deleted_node_checker*>
            (&local_128,&local_148,&local_158);
  std::
  unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
  ::
  insert<std::pair<std::__cxx11::string,dtc::fdt::checking::(anonymous_namespace)::deleted_node_checker*>>
            ((unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
              *)this,&local_128);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::(anonymous_namespace)::deleted_node_checker_*>
  ::~pair(&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  return;
}

Assistant:

check_manager::check_manager()
{
	// NOTE: All checks listed here MUST have a corresponding line
	// in the man page!
	add_property_type_checker<property_value::STRING_LIST>(
			"type-compatible", string("compatible"));
	add_property_type_checker<property_value::STRING>(
			"type-model", string("model"));
	add_property_size_checker("type-phandle", string("phandle"), 4);
	disabled_checkers.insert(std::make_pair(string("cells-attributes"),
		new address_cells_checker("cells-attributes")));
	checkers.insert(std::make_pair(string("deleted-nodes"),
		new deleted_node_checker("deleted-nodes")));
}